

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupSetPointerPluginTest::setup
          (TEST_GROUP_CppUTestGroupSetPointerPluginTest *this)

{
  TestRegistry *this_00;
  SetPointerPlugin *this_01;
  StringBufferTestOutput *this_02;
  TestResult *this_03;
  SimpleString local_30 [2];
  TEST_GROUP_CppUTestGroupSetPointerPluginTest *local_10;
  TEST_GROUP_CppUTestGroupSetPointerPluginTest *this_local;
  
  local_10 = this;
  this_00 = (TestRegistry *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x22);
  TestRegistry::TestRegistry(this_00);
  this->myRegistry_ = this_00;
  this_01 = (SetPointerPlugin *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x23);
  SimpleString::SimpleString(local_30,"TestSetPlugin");
  SetPointerPlugin::SetPointerPlugin(this_01,local_30);
  this->plugin_ = this_01;
  SimpleString::~SimpleString(local_30);
  (*this->myRegistry_->_vptr_TestRegistry[0x17])(this->myRegistry_);
  (*this->myRegistry_->_vptr_TestRegistry[0xd])(this->myRegistry_,this->plugin_);
  this_02 = (StringBufferTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x26);
  StringBufferTestOutput::StringBufferTestOutput(this_02);
  this->output_ = this_02;
  this_03 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x27);
  TestResult::TestResult(this_03,&this->output_->super_TestOutput);
  this->result_ = this_03;
  return;
}

Assistant:

void setup() _override
    {
        myRegistry_ = new TestRegistry();
        plugin_ = new SetPointerPlugin("TestSetPlugin");
        myRegistry_->setCurrentRegistry(myRegistry_);
        myRegistry_->installPlugin(plugin_);
        output_ = new StringBufferTestOutput();
        result_ = new TestResult(*output_);
    }